

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectTest(Gia_Man_t *p)

{
  int iVar1;
  undefined8 in_RAX;
  abctime aVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  abctime aVar3;
  int iVar4;
  undefined4 uStack_38;
  int iNode;
  
  _uStack_38 = in_RAX;
  aVar2 = Abc_Clock();
  p_00 = Vec_IntAlloc(100);
  Gia_ManIncrementTravId(p);
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pObj = Gia_ManCo(p,iVar4);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    _uStack_38 = CONCAT44(iVar1,uStack_38);
    Gia_ManCollectAnds(p,&iNode,1,p_00,(Vec_Int_t *)0x0);
  }
  Vec_IntFree(p_00);
  iVar4 = (int)p_00;
  Abc_Print(iVar4,"%s =","DFS from each output");
  aVar3 = Abc_Clock();
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return;
}

Assistant:

void Gia_ManCollectTest( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, iNode;
    abctime clk = Abc_Clock();
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        iNode = Gia_ObjId(p, pObj);
        Gia_ManCollectAnds( p, &iNode, 1, vNodes, NULL );
    }
    Vec_IntFree( vNodes );
    ABC_PRT( "DFS from each output", Abc_Clock() - clk );
}